

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParserImpl
          (ParserImpl *this,Descriptor *root_message_type,ZeroCopyInputStream *input_stream,
          ErrorCollector *error_collector,Finder *finder,ParseInfoTree *parse_info_tree,
          SingularOverwritePolicy singular_overwrite_policy,bool allow_case_insensitive_field,
          bool allow_unknown_field,bool allow_unknown_extension,bool allow_unknown_enum,
          bool allow_field_number,bool allow_relaxed_whitespace,bool allow_partial,
          int recursion_limit)

{
  this->error_collector_ = error_collector;
  this->finder_ = finder;
  this->parse_info_tree_ = parse_info_tree;
  (this->tokenizer_error_collector_).super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__ErrorCollector_006698a8;
  (this->tokenizer_error_collector_).parser_ = this;
  io::Tokenizer::Tokenizer
            (&this->tokenizer_,input_stream,&(this->tokenizer_error_collector_).super_ErrorCollector
            );
  this->root_message_type_ = root_message_type;
  this->singular_overwrite_policy_ = singular_overwrite_policy;
  this->allow_case_insensitive_field_ = allow_case_insensitive_field;
  this->allow_unknown_field_ = allow_unknown_field;
  this->allow_unknown_extension_ = allow_unknown_extension;
  this->allow_unknown_enum_ = allow_unknown_enum;
  this->allow_field_number_ = allow_field_number;
  this->allow_partial_ = allow_partial;
  this->recursion_limit_ = recursion_limit;
  this->had_errors_ = false;
  (this->tokenizer_).allow_f_after_float_ = true;
  (this->tokenizer_).comment_style_ = SH_COMMENT_STYLE;
  if (allow_relaxed_whitespace) {
    (this->tokenizer_).require_space_after_number_ = false;
    (this->tokenizer_).allow_multiline_strings_ = true;
  }
  io::Tokenizer::Next(&this->tokenizer_);
  return;
}

Assistant:

ParserImpl(const Descriptor* root_message_type,
             io::ZeroCopyInputStream* input_stream,
             io::ErrorCollector* error_collector,
             const TextFormat::Finder* finder, ParseInfoTree* parse_info_tree,
             SingularOverwritePolicy singular_overwrite_policy,
             bool allow_case_insensitive_field, bool allow_unknown_field,
             bool allow_unknown_extension, bool allow_unknown_enum,
             bool allow_field_number, bool allow_relaxed_whitespace,
             bool allow_partial, int recursion_limit)
      : error_collector_(error_collector),
        finder_(finder),
        parse_info_tree_(parse_info_tree),
        tokenizer_error_collector_(this),
        tokenizer_(input_stream, &tokenizer_error_collector_),
        root_message_type_(root_message_type),
        singular_overwrite_policy_(singular_overwrite_policy),
        allow_case_insensitive_field_(allow_case_insensitive_field),
        allow_unknown_field_(allow_unknown_field),
        allow_unknown_extension_(allow_unknown_extension),
        allow_unknown_enum_(allow_unknown_enum),
        allow_field_number_(allow_field_number),
        allow_partial_(allow_partial),
        recursion_limit_(recursion_limit),
        had_errors_(false) {
    // For backwards-compatibility with proto1, we need to allow the 'f' suffix
    // for floats.
    tokenizer_.set_allow_f_after_float(true);

    // '#' starts a comment.
    tokenizer_.set_comment_style(io::Tokenizer::SH_COMMENT_STYLE);

    if (allow_relaxed_whitespace) {
      tokenizer_.set_require_space_after_number(false);
      tokenizer_.set_allow_multiline_strings(true);
    }

    // Consume the starting token.
    tokenizer_.Next();
  }